

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

int impl_sign_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *private_key,
                     uint8_t *public_key,uint8_t *msg,size_t msglen,uint8_t *signature,
                     size_t *signature_len)

{
  byte bVar1;
  ushort uVar2;
  uint16_t *challengeC;
  uint16_t *puVar3;
  proof2_t *ppVar4;
  _Bool _Var5;
  int iVar6;
  randomTape_t *prVar7;
  tree_t *ptVar8;
  commitments_t *commitments;
  inputs_t inputs;
  msgs_t *msgs;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint16_t *missingLeaves;
  ulong uVar11;
  int iVar12;
  uint8_t *aux;
  int iVar13;
  randomTape_t *tapes;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  size_t sVar19;
  commitments_t *C;
  proof2_t *proof;
  ulong uVar20;
  msgs_t *pmVar21;
  size_t sVar22;
  uint16_t uVar23;
  long lVar24;
  BitSequence **data;
  bool bVar25;
  signature2_t sig;
  commitments_t Cv;
  commitments_t Ch;
  size_t cvInfoLen;
  tree_t iSeedsTree;
  mzd_local_t m_plaintext [1];
  tree_t treeCv;
  uint8_t *local_520;
  uint16_t local_4ea;
  inputs_t local_4e8;
  randomTape_t *local_4e0;
  tree_t *local_4d8;
  uint8_t *local_4d0;
  size_t local_4c8;
  undefined1 local_4c0 [16];
  uint8_t *puStack_4b0;
  uint8_t *puStack_4a8;
  uint8_t *local_4a0;
  size_t local_498;
  uint8_t *local_490;
  uint8_t *local_488;
  uint8_t *local_480;
  uint16_t *local_478;
  uint16_t *local_470;
  proof2_t *local_468;
  commitments_t local_458;
  commitments_t local_448;
  lowmc_simulate_online_f local_438;
  uint8_t *local_430;
  uint8_t *local_428;
  BitSequence *local_420;
  uint8_t *puStack_418;
  uint8_t *puStack_410;
  uint8_t *puStack_408;
  uint8_t local_400 [32];
  tree_t local_3e0;
  mzd_local_t local_3c0;
  undefined1 local_3a0 [8];
  bitset_word_t *pbStack_398;
  uint8_t *puStack_390;
  uint8_t *puStack_388;
  
  _Var5 = allocateSignature2((signature2_t *)local_4c0,instance);
  iVar6 = -1;
  if (!_Var5) goto LAB_0011bf18;
  bVar1 = instance->seed_size;
  if (instance->digest_size == ' ') {
    uVar15 = 0x540;
    uVar17 = 0x100;
  }
  else {
    uVar15 = 0x440;
    uVar17 = 0x200;
  }
  local_4c8 = msglen;
  Keccak_HashInitialize((Keccak_HashInstance *)local_3a0,uVar15,uVar17,0,'\x1f');
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,private_key,
                    (ulong)instance->input_output_size << 3);
  local_430 = msg;
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,msg,local_4c8 * 8);
  local_4d0 = public_key;
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,public_key,
                    (ulong)instance->input_output_size << 3);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,plaintext,
                    (ulong)instance->input_output_size << 3);
  local_420 = (BitSequence *)CONCAT62(local_420._2_6_,(instance->lowmc).n);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,(BitSequence *)&local_420,0x10);
  Keccak_HashFinal((Keccak_HashInstance *)local_3a0,(BitSequence *)0x0);
  Keccak_HashSqueeze((Keccak_HashInstance *)local_3a0,(BitSequence *)&local_420,
                     (ulong)bVar1 * 8 + 0x100);
  local_4c0._0_8_ = local_420;
  local_4c0._8_8_ = puStack_418;
  puStack_4b0 = puStack_410;
  puStack_4a8 = puStack_408;
  _Var5 = generateSeeds(&local_3e0,(uint)instance->num_rounds,local_400,local_4c0,0,instance);
  iVar6 = -1;
  if (!_Var5) goto LAB_0011bbd6;
  local_428 = getLeaves(&local_3e0);
  if (local_428 == (uint8_t *)0x0) {
    iVar6 = -1;
LAB_0011bbc5:
    clearTree(&local_3e0);
  }
  else {
    uVar2 = instance->num_rounds;
    prVar7 = (randomTape_t *)calloc((ulong)uVar2,0x98);
    ptVar8 = (tree_t *)calloc((ulong)uVar2,0x20);
    commitments = allocateCommitments(instance,0);
    inputs = allocateInputs(instance);
    msgs = allocateMsgs(instance);
    iVar13 = -1;
    local_4d8 = ptVar8;
    if ((msgs == (msgs_t *)0x0 || (inputs == (inputs_t)0x0 || commitments == (commitments_t *)0x0))
        || (ptVar8 == (tree_t *)0x0 || prVar7 == (randomTape_t *)0x0)) {
LAB_0011bb9e:
      freeMsgs(msgs);
      freeInputs(inputs);
      freeCommitments(commitments);
      free(local_4d8);
      free(prVar7);
      iVar6 = iVar13;
      goto LAB_0011bbc5;
    }
    allocateCommitments2(&local_448,instance,(ulong)instance->num_rounds);
    allocateCommitments2(&local_458,instance,(ulong)instance->num_rounds);
    local_3c0.w64 = (word  [4])ZEXT1632(ZEXT816(0) << 0x40);
    mzd_from_char_array(&local_3c0,plaintext,(ulong)instance->input_output_size);
    local_438 = lowmc_simulate_online_get_implementation(&instance->lowmc);
    iVar12 = 4;
    local_4e8 = inputs;
    local_4e0 = prVar7;
    if (instance->num_rounds != 0) {
      sVar19 = 0;
      do {
        ptVar8 = local_4d8 + sVar19;
        _Var5 = generateSeeds(ptVar8,(uint)instance->num_MPC_parties,
                              local_428 + instance->seed_size * sVar19,local_4c0,sVar19,instance);
        if (!_Var5) {
          iVar12 = 7;
          goto LAB_0011b412;
        }
        tapes = prVar7 + sVar19;
        puVar9 = getLeaves(ptVar8);
        createRandomTapes(tapes,puVar9,local_4c0,sVar19,instance);
        computeAuxTape(tapes,local_4e8[sVar19],instance);
        uVar20 = (ulong)instance->num_MPC_parties;
        if (instance->num_MPC_parties != 0) {
          lVar24 = 0;
          sVar18 = 0;
          do {
            uVar17 = (uint)sVar18;
            local_3a0 = (undefined1  [8])getLeaf(ptVar8,uVar17);
            pbStack_398 = (bitset_word_t *)getLeaf(ptVar8,uVar17 + 1);
            puStack_390 = getLeaf(ptVar8,uVar17 + 2);
            puStack_388 = getLeaf(ptVar8,uVar17 + 3);
            commit_x4((uint8_t **)((long)commitments[sVar19].hashes + lVar24),(uint8_t **)local_3a0,
                      local_4c0,sVar19,sVar18,instance);
            sVar18 = sVar18 + 4;
            uVar20 = (ulong)instance->num_MPC_parties;
            lVar24 = lVar24 + 0x20;
            prVar7 = local_4e0;
          } while (sVar18 < uVar20);
        }
        puVar9 = commitments[sVar19].hashes[uVar20 - 1];
        puVar10 = getLeaf(ptVar8,(int)uVar20 - 1);
        commit(puVar9,puVar10,tapes->aux_bits,local_4c0,sVar19,uVar20 - 1,instance);
        sVar19 = sVar19 + 1;
      } while (sVar19 < instance->num_rounds);
      iVar12 = 4;
    }
LAB_0011b412:
    iVar6 = -1;
    iVar13 = -1;
    if (iVar12 == 7) {
LAB_0011bb29:
      if (instance->num_rounds != 0) {
        uVar20 = 0;
        ptVar8 = local_4d8;
        prVar7 = local_4e0;
        do {
          freeRandomTape(prVar7);
          clearTree(ptVar8);
          uVar20 = uVar20 + 1;
          ptVar8 = ptVar8 + 1;
          prVar7 = prVar7 + 1;
        } while (uVar20 < instance->num_rounds);
      }
      freeCommitments2(&local_458);
      freeCommitments2(&local_448);
      inputs = local_4e8;
      prVar7 = local_4e0;
      goto LAB_0011bb9e;
    }
    if (iVar12 == 4) {
      iVar12 = 0xb;
      if (instance->num_rounds != 0) {
        uVar20 = 0;
        do {
          puVar9 = local_4e8[uVar20];
          bVar1 = instance->input_output_size;
          if ((ulong)bVar1 != 0) {
            uVar11 = 0;
            do {
              puVar9[uVar11] = puVar9[uVar11] ^ private_key[uVar11];
              uVar11 = uVar11 + 1;
            } while (bVar1 != uVar11);
          }
          uVar2 = (instance->lowmc).n;
          uVar11 = (ulong)uVar2;
          bVar1 = instance->input_output_size;
          if (uVar2 < (ushort)((ushort)bVar1 * 8)) {
            do {
              bVar1 = ~(byte)uVar11 & 7;
              puVar9[uVar11 >> 3] = puVar9[uVar11 >> 3] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
              uVar11 = uVar11 + 1;
              bVar1 = instance->input_output_size;
            } while (uVar11 < (uint)bVar1 * 8);
          }
          local_3a0 = (undefined1  [8])0x0;
          pbStack_398 = (bitset_word_t *)0x0;
          puStack_390 = (uint8_t *)0x0;
          puStack_388 = (uint8_t *)0x0;
          mzd_from_char_array((mzd_local_t *)local_3a0,puVar9,(ulong)bVar1);
          iVar6 = (*local_438)((mzd_local_t *)local_3a0,prVar7 + uVar20,msgs + uVar20,&local_3c0,
                               local_4d0,instance);
          if (iVar6 != 0) {
            iVar12 = 7;
            goto LAB_0011b553;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < instance->num_rounds);
        iVar12 = 0xb;
      }
LAB_0011b553:
      iVar6 = -1;
      iVar13 = -1;
      if (iVar12 != 7) {
        if (iVar12 != 0xb) goto LAB_0011bbd6;
        if (instance->num_rounds < 4) {
          uVar20 = 0;
        }
        else {
          pmVar21 = msgs + 3;
          uVar20 = 0;
          do {
            commit_h_x4(local_448.hashes + uVar20,commitments + uVar20,instance);
            data = local_458.hashes + uVar20;
            if (instance->digest_size == ' ') {
              uVar15 = 0x540;
              uVar17 = 0x100;
            }
            else {
              uVar15 = 0x440;
              uVar17 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,uVar15,uVar17,0,'\x1f');
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,local_4e8 + uVar20,
                       (ulong)instance->input_output_size << 3);
            if (instance->num_MPC_parties != '\0') {
              uVar11 = 0;
              do {
                local_420 = pmVar21[-3].msgs[uVar11];
                puStack_418 = pmVar21[-2].msgs[uVar11];
                puStack_410 = pmVar21[-1].msgs[uVar11];
                puStack_408 = pmVar21->msgs[uVar11];
                Keccak_HashUpdatetimes4
                          ((Keccak_HashInstancetimes4 *)local_3a0,&local_420,
                           (ulong)((int)msgs[uVar20].pos + 7U & 0xfffffff8));
                uVar11 = uVar11 + 1;
              } while (uVar11 < instance->num_MPC_parties);
            }
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_3a0,(BitSequence **)0x0);
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,data,(ulong)instance->digest_size << 3
                      );
            uVar20 = uVar20 + 4;
            pmVar21 = pmVar21 + 4;
          } while (uVar20 < (instance->num_rounds & 0xfffffffc));
        }
        uVar2 = instance->num_rounds;
        if (uVar20 < uVar2) {
          pmVar21 = msgs + uVar20;
          C = commitments + uVar20;
          do {
            commit_h(local_448.hashes[uVar20],C,instance);
            commit_v(local_458.hashes[uVar20],local_4e8[uVar20],pmVar21,instance);
            uVar20 = uVar20 + 1;
            uVar2 = instance->num_rounds;
            pmVar21 = pmVar21 + 1;
            C = C + 1;
          } while (uVar20 < uVar2);
        }
        _Var5 = createTree((tree_t *)local_3a0,(uint)uVar2,(uint)instance->digest_size);
        if (_Var5) {
          buildMerkleTree((tree_t *)local_3a0,local_458.hashes,local_4c0,instance);
          puVar3 = local_470;
          challengeC = local_478;
          HCP(local_480,local_478,local_470,&local_448,(uint8_t *)local_3a0,local_4c0,local_4d0,
              plaintext,local_430,local_4c8,instance);
          uVar2 = instance->num_rounds;
          bVar1 = instance->num_opened_rounds;
          missingLeaves = getMissingLeavesList(challengeC,instance);
          local_420 = (uint8_t *)0x0;
          puVar9 = openMerkleTree((tree_t *)local_3a0,missingLeaves,(ulong)uVar2 - (ulong)bVar1,
                                  (size_t *)&local_420);
          free(missingLeaves);
          clearTree((tree_t *)local_3a0);
          iVar13 = -1;
          if (puVar9 != (uint8_t *)0x0) {
            local_488 = local_420;
            sVar22 = (ulong)instance->seed_size * (ulong)instance->num_rounds;
            local_490 = puVar9;
            local_4a0 = (uint8_t *)malloc(sVar22);
            local_498 = revealSeeds(&local_3e0,challengeC,(ulong)instance->num_opened_rounds,
                                    local_4a0,sVar22,instance);
            local_4a0 = (uint8_t *)realloc(local_4a0,local_498);
            ppVar4 = local_468;
            if (instance->num_rounds != 0) {
              sVar19 = 0;
              do {
                uVar20 = (ulong)instance->num_opened_rounds;
                bVar25 = uVar20 != 0;
                uVar23 = (uint16_t)sVar19;
                if (uVar20 == 0) {
LAB_0011b959:
                  if (bVar25) goto LAB_0011b961;
                }
                else {
                  if (*challengeC != uVar23) {
                    uVar11 = 0;
                    do {
                      uVar16 = uVar20;
                      if (uVar20 - 1 == uVar11) break;
                      uVar16 = uVar11 + 1;
                      lVar24 = uVar11 + 1;
                      uVar11 = uVar16;
                    } while (challengeC[lVar24] != uVar23);
                    bVar25 = uVar16 < uVar20;
                    goto LAB_0011b959;
                  }
LAB_0011b961:
                  proof = ppVar4 + sVar19;
                  allocateProof2(proof,instance);
                  uVar20 = 0xffffffffffffffff;
                  if ((ulong)instance->num_opened_rounds != 0) {
                    uVar11 = 0;
                    do {
                      uVar20 = uVar11;
                      if (challengeC[uVar11] == uVar23) break;
                      uVar11 = uVar11 + 1;
                      uVar20 = 0xffffffffffffffff;
                    } while (instance->num_opened_rounds != uVar11);
                  }
                  proof->unOpenedIndex = puVar3[uVar20];
                  local_4ea = puVar3[uVar20];
                  sVar22 = (ulong)instance->seed_size * (ulong)instance->num_MPC_parties;
                  puVar9 = (uint8_t *)malloc(sVar22);
                  proof->seedInfo = puVar9;
                  ptVar8 = local_4d8 + sVar19;
                  sVar18 = revealSeeds(ptVar8,&local_4ea,1,puVar9,sVar22,instance);
                  proof->seedInfoLen = sVar18;
                  puVar9 = (uint8_t *)realloc(proof->seedInfo,sVar18);
                  proof->seedInfo = puVar9;
                  if ((ulong)instance->num_MPC_parties - 1 != (ulong)puVar3[uVar20]) {
                    memcpy(proof->aux,local_4e0[sVar19].aux_bits,(ulong)instance->view_size);
                  }
                  memcpy(proof->input,local_4e8[sVar19],(ulong)instance->input_output_size);
                  memcpy(proof->msgs,msgs[sVar19].msgs[puVar3[uVar20]],(ulong)instance->view_size);
                  uVar2 = proof->unOpenedIndex;
                  bVar1 = instance->num_MPC_parties;
                  puVar9 = proof->C;
                  puVar10 = getLeaf(ptVar8,(uint)uVar2);
                  if (bVar1 - 1 == (uint)uVar2) {
                    aux = local_4e0[sVar19].aux_bits;
                  }
                  else {
                    aux = (uint8_t *)0x0;
                  }
                  commit(puVar9,puVar10,aux,local_4c0,sVar19,(ulong)proof->unOpenedIndex,instance);
                }
                sVar19 = sVar19 + 1;
              } while (sVar19 < instance->num_rounds);
            }
            iVar13 = 0;
          }
        }
        else {
          iVar13 = -1;
        }
      }
      goto LAB_0011bb29;
    }
  }
LAB_0011bbd6:
  puVar9 = local_488;
  sVar19 = local_498;
  if (iVar6 == 0) {
    bVar1 = instance->digest_size;
    local_520 = local_488 + (ulong)bVar1 + 0x20 + local_498;
    if ((ulong)instance->num_rounds != 0) {
      uVar20 = (ulong)instance->num_opened_rounds;
      uVar11 = 0;
      do {
        bVar25 = uVar20 != 0;
        if (uVar20 == 0) {
LAB_0011bc9b:
          if (bVar25) goto LAB_0011bc9f;
        }
        else {
          if (uVar11 != *local_478) {
            uVar16 = 0;
            do {
              uVar14 = uVar20;
              if (uVar20 - 1 == uVar16) break;
              lVar24 = uVar16 + 1;
              uVar14 = uVar16 + 1;
              uVar16 = uVar14;
            } while (uVar11 != local_478[lVar24]);
            bVar25 = uVar14 < uVar20;
            goto LAB_0011bc9b;
          }
LAB_0011bc9f:
          uVar16 = 0xffffffffffffffff;
          if (uVar20 != 0) {
            uVar14 = 0;
            do {
              uVar16 = uVar14;
              if (uVar11 == local_478[uVar14]) break;
              uVar14 = uVar14 + 1;
              uVar16 = 0xffffffffffffffff;
            } while (uVar20 != uVar14);
          }
          uVar14 = (ulong)instance->view_size;
          if (instance->num_MPC_parties - 1 == (uint)local_470[uVar16]) {
            uVar14 = 0;
          }
          local_520 = local_520 +
                      uVar14 + local_468[uVar11].seedInfoLen +
                               (ulong)((uint)instance->input_output_size + (uint)bVar1 +
                                      (uint)instance->view_size);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != instance->num_rounds);
    }
    iVar13 = -1;
    if (local_520 <= (uint8_t *)*signature_len) {
      memcpy(signature,local_480,(ulong)bVar1);
      bVar1 = instance->digest_size;
      puVar10 = signature + (ulong)bVar1 + 0x20;
      *(undefined8 *)(puVar10 + -0x20) = local_4c0._0_8_;
      *(undefined8 *)(puVar10 + -0x18) = local_4c0._8_8_;
      *(uint8_t **)(puVar10 + -0x10) = puStack_4b0;
      *(uint8_t **)(puVar10 + -8) = puStack_4a8;
      memcpy(puVar10,local_4a0,sVar19);
      memcpy(signature + sVar19 + 0x20 + (ulong)bVar1,local_490,(size_t)puVar9);
      if (instance->num_rounds != 0) {
        puVar9 = signature + sVar19 + 0x20 + (ulong)bVar1 + (long)puVar9;
        uVar20 = 0;
        do {
          uVar11 = (ulong)instance->num_opened_rounds;
          bVar25 = uVar11 != 0;
          if (uVar11 == 0) {
LAB_0011bdee:
            if (bVar25) goto LAB_0011bdf6;
          }
          else {
            if (uVar20 != *local_478) {
              uVar16 = 0;
              do {
                uVar14 = uVar11;
                if (uVar11 - 1 == uVar16) break;
                lVar24 = uVar16 + 1;
                uVar14 = uVar16 + 1;
                uVar16 = uVar14;
              } while (uVar20 != local_478[lVar24]);
              bVar25 = uVar14 < uVar11;
              goto LAB_0011bdee;
            }
LAB_0011bdf6:
            memcpy(puVar9,local_468[uVar20].seedInfo,local_468[uVar20].seedInfoLen);
            uVar11 = 0xffffffffffffffff;
            if ((ulong)instance->num_opened_rounds != 0) {
              uVar16 = 0;
              do {
                uVar11 = uVar16;
                if (uVar20 == local_478[uVar16]) break;
                uVar16 = uVar16 + 1;
                uVar11 = 0xffffffffffffffff;
              } while (instance->num_opened_rounds != uVar16);
            }
            puVar9 = puVar9 + local_468[uVar20].seedInfoLen;
            if (instance->num_MPC_parties - 1 != (uint)local_470[uVar11]) {
              memcpy(puVar9,local_468[uVar20].aux,(ulong)instance->view_size);
              puVar9 = puVar9 + instance->view_size;
            }
            memcpy(puVar9,local_468[uVar20].input,(ulong)instance->input_output_size);
            puVar9 = puVar9 + instance->input_output_size;
            memcpy(puVar9,local_468[uVar20].msgs,(ulong)instance->view_size);
            bVar1 = instance->view_size;
            memcpy(puVar9 + bVar1,local_468[uVar20].C,(ulong)instance->digest_size);
            puVar9 = puVar9 + bVar1 + instance->digest_size;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < instance->num_rounds);
      }
      iVar13 = (int)local_520;
    }
    iVar6 = -1;
    if (iVar13 != -1) {
      *signature_len = (long)iVar13;
      iVar6 = 0;
    }
  }
LAB_0011bf18:
  freeSignature2((signature2_t *)local_4c0,instance);
  return iVar6;
}

Assistant:

int impl_sign_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                      const uint8_t* private_key, const uint8_t* public_key, const uint8_t* msg,
                      size_t msglen, uint8_t* signature, size_t* signature_len) {
  signature2_t sig;
  int ret = -1;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = sign_picnic3(private_key, public_key, plaintext, msg, msglen, &sig, instance);
  picnic_declassify(&ret, sizeof(ret));
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to create signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = serializeSignature2(&sig, signature, *signature_len, instance);
  if (ret == -1) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to serialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }
  *signature_len = ret;
  ret            = 0;

Exit:
  freeSignature2(&sig, instance);
  return ret;
}